

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O0

bool __thiscall
magic_enum::containers::
bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
          (bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
           *this,Color pos)

{
  bool bVar1;
  unsigned_long *puVar2;
  out_of_range *this_00;
  optional<unsigned_long> oVar3;
  reference_impl<const_magic_enum::containers::bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_*>
  local_40;
  _Storage<unsigned_long,_true> local_28;
  optional<unsigned_long> i;
  Color pos_local;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  *this_local;
  
  i.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = pos;
  oVar3 = detail::indexing<Color,_std::less<Color>,_void>::at(pos);
  local_28._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  i.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_28);
  if (!bVar1) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"magic_enum::containers::bitset::test: Unrecognized position");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  puVar2 = Catch::clara::std::optional<unsigned_long>::operator*
                     ((optional<unsigned_long> *)&local_28);
  reference_impl<const_magic_enum::containers::bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_*>
  ::reference_impl(&local_40,this,*puVar2);
  bVar1 = containers::bitset::reference_impl::operator_cast_to_bool((reference_impl *)&local_40);
  return bVar1;
}

Assistant:

constexpr bool test(E pos) const {
    if (auto i = index_type::at(pos)) {
      return static_cast<bool>(const_reference(this, *i));
    }
    MAGIC_ENUM_THROW(std::out_of_range("magic_enum::containers::bitset::test: Unrecognized position"));
  }